

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

void Sfm_TimStop(Sfm_Tim_t *p)

{
  void *__ptr;
  Vec_Int_t *__ptr_00;
  long lVar1;
  long lVar2;
  
  Vec_IntErase(&p->vTimArrs);
  Vec_IntErase(&p->vTimReqs);
  __ptr_00 = (p->vLevels).pArray;
  lVar1 = 8;
  for (lVar2 = 0; lVar2 < (p->vLevels).nCap; lVar2 = lVar2 + 1) {
    __ptr = *(void **)((long)&__ptr_00->nCap + lVar1);
    if (__ptr != (void *)0x0) {
      free(__ptr);
      __ptr_00 = (p->vLevels).pArray;
      *(undefined8 *)((long)&__ptr_00->nCap + lVar1) = 0;
    }
    lVar1 = lVar1 + 0x10;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
    (p->vLevels).pArray = (Vec_Int_t *)0x0;
  }
  (p->vLevels).nCap = 0;
  (p->vLevels).nSize = 0;
  Vec_IntErase(&p->vPath);
  free((p->vSortData).pArray);
  free(p);
  return;
}

Assistant:

void Sfm_TimStop( Sfm_Tim_t * p )
{
    Vec_IntErase( &p->vTimArrs );
    Vec_IntErase( &p->vTimReqs );
    Vec_WecErase( &p->vLevels );
    Vec_IntErase( &p->vPath );
    Vec_WrdErase( &p->vSortData );
    ABC_FREE( p );
}